

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O2

bool __thiscall
CoreML::Specification::Metadata::MergePartialFromCodedStream(Metadata *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  bool bVar4;
  uint32 uVar5;
  string *psVar6;
  char *field_name;
  char cVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  pointer data;
  Parser<google::protobuf::internal::MapFieldLite<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parser;
  
  do {
    pbVar3 = input->buffer_;
    uVar5 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      uVar10 = (ulong)bVar2;
      pbVar1 = pbVar3 + 1;
      uVar8 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar5 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar5 = uVar8, (~(uint)*pbVar1 & uVar8) < 0x80))
        goto LAB_004da3c6;
        uVar10 = (ulong)((uVar8 + (uint)*pbVar1 * 0x80) - 0x80);
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar10 = uVar10 | 0x100000000;
    }
    else {
LAB_004da3c6:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar10 = 0;
      if (uVar5 - 1 < 0x3fff) {
        uVar10 = 0x100000000;
      }
      uVar10 = uVar5 | uVar10;
    }
    uVar5 = (uint32)uVar10;
    if ((uVar10 & 0x100000000) == 0) {
LAB_004da1c1:
      if (uVar5 == 0) {
        return true;
      }
      if ((uVar5 & 7) == 4) {
        return true;
      }
      bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar5);
    }
    else {
      uVar8 = (uint)(uVar10 >> 3) & 0x1fffffff;
      cVar7 = (char)uVar10;
      switch(uVar8) {
      case 1:
        if (cVar7 != '\n') goto LAB_004da1c1;
        psVar6 = mutable_shortdescription_abi_cxx11_(this);
        bVar4 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar6);
        if (!bVar4) goto LAB_004da3fe;
        psVar6 = (this->shortdescription_).ptr_;
        data = (psVar6->_M_dataplus)._M_p;
        iVar9 = (int)psVar6->_M_string_length;
        field_name = "CoreML.Specification.Metadata.shortDescription";
        break;
      case 2:
        if (cVar7 != '\x12') goto LAB_004da1c1;
        psVar6 = mutable_versionstring_abi_cxx11_(this);
        bVar4 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar6);
        if (!bVar4) goto LAB_004da3fe;
        psVar6 = (this->versionstring_).ptr_;
        data = (psVar6->_M_dataplus)._M_p;
        iVar9 = (int)psVar6->_M_string_length;
        field_name = "CoreML.Specification.Metadata.versionString";
        break;
      case 3:
        if (cVar7 != '\x1a') goto LAB_004da1c1;
        psVar6 = mutable_author_abi_cxx11_(this);
        bVar4 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar6);
        if (!bVar4) goto LAB_004da3fe;
        psVar6 = (this->author_).ptr_;
        data = (psVar6->_M_dataplus)._M_p;
        iVar9 = (int)psVar6->_M_string_length;
        field_name = "CoreML.Specification.Metadata.author";
        break;
      case 4:
        if (cVar7 != '\"') goto LAB_004da1c1;
        psVar6 = mutable_license_abi_cxx11_(this);
        bVar4 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar6);
        if (!bVar4) goto LAB_004da3fe;
        psVar6 = (this->license_).ptr_;
        data = (psVar6->_M_dataplus)._M_p;
        iVar9 = (int)psVar6->_M_string_length;
        field_name = "CoreML.Specification.Metadata.license";
        break;
      default:
        if ((uVar8 != 100) || (cVar7 != '\"')) goto LAB_004da1c1;
        parser.key_._M_dataplus._M_p = (pointer)&parser.key_.field_2;
        parser.key_._M_string_length = 0;
        parser.key_.field_2._M_local_buf[0] = '\0';
        parser.entry_.ptr_ =
             (MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
              *)0x0;
        parser.mf_ = &this->userdefined_;
        parser.map_ = &(this->userdefined_).map_;
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<google::protobuf::internal::MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::string,std::__cxx11::string,(google::protobuf::internal::WireFormatLite::FieldType)9,(google::protobuf::internal::WireFormatLite::FieldType)9,0>,google::protobuf::MessageLite,std::__cxx11::string,std::__cxx11::string,(google::protobuf::internal::WireFormatLite::FieldType)9,(google::protobuf::internal::WireFormatLite::FieldType)9,0>::Parser<google::protobuf::internal::MapFieldLite<google::protobuf::internal::MapEntryLite<std::__cxx11::string,std::__cxx11::string,(google::protobuf::internal::WireFormatLite::FieldType)9,(google::protobuf::internal::WireFormatLite::FieldType)9,0>,std::__cxx11::string,std::__cxx11::string,(google::protobuf::internal::WireFormatLite::FieldType)9,(google::protobuf::internal::WireFormatLite::FieldType)9,0>,google::protobuf::Map<std::__cxx11::string,std::__cxx11::string>>>
                          (input,&parser);
        if (bVar4) {
          bVar4 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                            (parser.key_._M_dataplus._M_p,(int)parser.key_._M_string_length,PARSE,
                             "CoreML.Specification.Metadata.UserDefinedEntry.key");
          if (!bVar4) goto LAB_004da3ea;
          bVar4 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                            (((parser.value_ptr_)->_M_dataplus)._M_p,
                             (int)(parser.value_ptr_)->_M_string_length,PARSE,
                             "CoreML.Specification.Metadata.UserDefinedEntry.value");
          iVar9 = 6;
          if (bVar4) {
            iVar9 = 0;
          }
        }
        else {
LAB_004da3ea:
          bVar4 = false;
          iVar9 = 6;
        }
        google::protobuf::internal::
        MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
        ::
        Parser<google::protobuf::internal::MapFieldLite<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~Parser(&parser);
        if (bVar4 != false) goto LAB_004da1e9;
        goto LAB_004da1ec;
      }
      bVar4 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                        (data,iVar9,PARSE,field_name);
    }
    if (bVar4 == false) goto LAB_004da3fe;
LAB_004da1e9:
    iVar9 = 0;
LAB_004da1ec:
  } while (iVar9 == 0);
  bVar4 = true;
  if (iVar9 == 6) {
LAB_004da3fe:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool Metadata::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.Metadata)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // string shortDescription = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_shortdescription()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->shortdescription().data(), this->shortdescription().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.Metadata.shortDescription"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string versionString = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_versionstring()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->versionstring().data(), this->versionstring().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.Metadata.versionString"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string author = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_author()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->author().data(), this->author().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.Metadata.author"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string license = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_license()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->license().data(), this->license().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.Metadata.license"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // map<string, string> userDefined = 100;
      case 100: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(802u)) {
          Metadata_UserDefinedEntry::Parser< ::google::protobuf::internal::MapFieldLite<
              Metadata_UserDefinedEntry,
              ::std::string, ::std::string,
              ::google::protobuf::internal::WireFormatLite::TYPE_STRING,
              ::google::protobuf::internal::WireFormatLite::TYPE_STRING,
              0 >,
            ::google::protobuf::Map< ::std::string, ::std::string > > parser(&userdefined_);
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
              input, &parser));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            parser.key().data(), parser.key().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.Metadata.UserDefinedEntry.key"));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            parser.value().data(), parser.value().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.Metadata.UserDefinedEntry.value"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.Metadata)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.Metadata)
  return false;
#undef DO_
}